

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void * canvas_undo_set_paste(_glist *x,int numpasted,int duplicate,int d_offset)

{
  _gobj *p_Var1;
  t_selection *ptVar2;
  int *piVar3;
  _binbuf *p_Var4;
  t_gobj *ptVar5;
  int iVar6;
  
  piVar3 = (int *)getbytes(0x18);
  iVar6 = 0;
  ptVar5 = x->gl_list;
  for (p_Var1 = ptVar5; p_Var1 != (t_gobj *)0x0; p_Var1 = p_Var1->g_next) {
    iVar6 = iVar6 + 1;
  }
  *piVar3 = iVar6 - numpasted;
  iVar6 = -1;
  if ((((duplicate == 0) && (ptVar2 = x->gl_editor->e_selection, ptVar2 != (t_selection *)0x0)) &&
      (ptVar2->sel_next == (_selection *)0x0)) &&
     ((iVar6 = 0, ptVar5 != (t_gobj *)0x0 && (ptVar5 != ptVar2->sel_what)))) {
    iVar6 = 0;
    do {
      iVar6 = iVar6 + 1;
      ptVar5 = ptVar5->g_next;
      if (ptVar5 == (t_gobj *)0x0) break;
    } while (ptVar5 != ptVar2->sel_what);
  }
  piVar3[1] = iVar6;
  piVar3[2] = d_offset;
  p_Var4 = binbuf_duplicate(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
  *(_binbuf **)(piVar3 + 4) = p_Var4;
  return piVar3;
}

Assistant:

void *canvas_undo_set_paste(t_canvas *x, int numpasted, int duplicate,
    int d_offset)
{
    t_undo_paste *buf =  (t_undo_paste *)getbytes(sizeof(*buf));
    buf->u_index = glist_getindex(x, 0) - numpasted; /* do we need numpasted at all? */
    if (!duplicate && x->gl_editor->e_selection &&
        !x->gl_editor->e_selection->sel_next)
    {
            /* if only one object is selected which will warrant autopatching */
        buf->u_sel_index = glist_getindex(x,
            x->gl_editor->e_selection->sel_what);
    }
    else
    {
        buf->u_sel_index = -1;
    }
    buf->u_offset = d_offset;
    buf->u_objectbuf = binbuf_duplicate(EDITOR->copy_binbuf);
    return (buf);
}